

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

string * __thiscall
kws::Parser::FindPreviousWord(Parser *this,size_t pos,bool withComments,string *buffer)

{
  ulong uVar1;
  char *pcVar2;
  byte in_CL;
  ulong in_RDX;
  long in_RSI;
  string *in_RDI;
  string *in_R8;
  bool bVar3;
  string store;
  bool first;
  bool inWord;
  size_t i;
  string stream;
  string *ivar;
  byte local_d1;
  string local_88 [36];
  allocator local_64;
  undefined1 local_63;
  byte local_62;
  byte local_61;
  ulong local_60;
  string local_48 [47];
  byte local_19;
  ulong local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_48,in_R8);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (std::__cxx11::string::operator=(local_48,(string *)(in_RSI + 0x518)), (local_19 & 1) != 0)) {
    std::__cxx11::string::operator=(local_48,(string *)(in_RSI + 0x4f8));
  }
  local_60 = local_18;
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    bVar3 = false;
    if (*pcVar2 != ' ') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      bVar3 = false;
      if (*pcVar2 != '\r') {
        bVar3 = local_60 != 0;
      }
    }
    if (!bVar3) break;
    local_60 = local_60 - 1;
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
  if ((*pcVar2 == '\r') && (1 < local_60)) {
    local_60 = local_60 - 1;
  }
  local_61 = 1;
  local_62 = 0;
  local_63 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_64);
  std::allocator<char>::~allocator((allocator<char> *)&local_64);
  while( true ) {
    local_d1 = 0;
    if (local_60 != 0xffffffffffffffff) {
      local_d1 = local_61;
    }
    if ((local_d1 & 1) == 0) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if (((*pcVar2 == ' ') ||
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar2 == '\n')) ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar2 == '\r')) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      if ((*pcVar2 != '\r') && ((local_62 & 1) != 0)) {
        local_61 = 0;
      }
    }
    else {
      std::__cxx11::string::string(local_88,(string *)in_RDI);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      std::__cxx11::string::operator=((string *)in_RDI,*pcVar2);
      std::__cxx11::string::operator+=((string *)in_RDI,local_88);
      local_61 = 1;
      local_62 = 1;
      std::__cxx11::string::~string(local_88);
    }
    local_60 = local_60 - 1;
  }
  local_63 = 1;
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

std::string Parser::FindPreviousWord(size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  size_t i=pos;

  while(stream[i] != ' ' && stream[i] != '\r' && i>0)
    {
    i--;
    }

  if(stream[i] == '\r' && i>1)
    {
    i--;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i != std::string::npos && inWord)
    {
    if(stream[i] != ' ' && stream[i] != '\n' && stream[i] != '\r')
      {
      std::string store = ivar;
      ivar = stream[i];
      ivar += store;
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(stream[i] == '\r')
        {
        // do nothing
        }
      else if(first)
        {
        inWord = false;
        }
      }
    i--;
    }
  return ivar;
}